

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# old_lan.c
# Opt level: O3

int olsrv2_validate_lan(cfg_schema_entry *entry,char *section_name,char *value,autobuf *out)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  _lan_data_conflict data;
  netaddr_str buf;
  os_route_key prefix;
  _lan_data_conflict local_b4;
  char local_92 [62];
  os_route_key local_54;
  
  if (value == (char *)0x0) {
    cfg_schema_help_netaddr(entry,out);
    iVar3 = 0;
    cfg_append_printable_line
              (out,"    This value is followed by a list of four optional parameters.");
    cfg_append_printable_line
              (out,
               "    - \'src=<prefix>\' the source specific prefix of this attached network. The default is 2."
              );
    cfg_append_printable_line
              (out,
               "    - \'metric=<m>\' the link metric of the LAN (between %u and %u). The default is 0."
               ,1,0xffff00);
    cfg_append_printable_line
              (out,
               "    - \'domain=<d>\' the domain of the LAN (between 0 and 255) or \'all\'. The default is all."
              );
    cfg_append_printable_line
              (out,
               "    - \'dist=<d>\' the hopcount distance of the LAN (between 0 and 255). The default is 2."
              );
  }
  else {
    pcVar2 = str_cpynextword(local_92,value,0x3e);
    iVar1 = cfg_schema_validate_netaddr(entry,section_name,local_92,out);
    iVar3 = -1;
    if ((iVar1 == 0) && (iVar1 = netaddr_from_string(&local_54.dst,local_92), iVar1 == 0)) {
      pcVar2 = _parse_lan_parameters(&local_54,&local_b4,pcVar2);
      if (pcVar2 == (char *)0x0) {
        if (local_b4.metric - 0xffff01 < 0xff000100) {
          cfg_append_printable_line
                    (out,"Metric %u for prefix %s must be between %u and %u",(ulong)local_b4.metric,
                     local_92,1,0xffff00);
        }
        else {
          if (local_b4.dist < 0x100) {
            return 0;
          }
          cfg_append_printable_line
                    (out,"Distance %u for prefix %s must be between 0 and 255",(ulong)local_b4.dist,
                     local_92);
        }
      }
      else {
        cfg_append_printable_line
                  (out,"Value \'%s\' for entry \'%s\' in section %s has %s",value,(entry->key).entry
                   ,section_name,pcVar2);
      }
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int
olsrv2_validate_lan(
  const struct cfg_schema_entry *entry, const char *section_name, const char *value, struct autobuf *out) {
  struct netaddr_str buf;
  struct _lan_data data;
  const char *ptr, *result;
  struct os_route_key prefix;

  if (value == NULL) {
    cfg_schema_help_netaddr(entry, out);
    cfg_append_printable_line(out, "    This value is followed by a list of four optional parameters.");
    cfg_append_printable_line(out,
      "    - '" LAN_OPTION_SRC "<prefix>' the source specific prefix of this attached network."
      " The default is 2.");
    cfg_append_printable_line(out,
      "    - '" LAN_OPTION_METRIC "<m>' the link metric of the LAN (between %u and %u)."
      " The default is 0.",
      RFC7181_METRIC_MIN, RFC7181_METRIC_MAX);
    cfg_append_printable_line(out,
      "    - '" LAN_OPTION_DOMAIN "<d>' the domain of the LAN (between 0 and 255) or 'all'."
      " The default is all.");
    cfg_append_printable_line(out,
      "    - '" LAN_OPTION_DIST "<d>' the hopcount distance of the LAN (between 0 and 255)."
      " The default is 2.");
    return 0;
  }

  ptr = str_cpynextword(buf.buf, value, sizeof(buf));
  if (cfg_schema_validate_netaddr(entry, section_name, buf.buf, out)) {
    /* check prefix first */
    return -1;
  }

  if (netaddr_from_string(&prefix.dst, buf.buf)) {
    return -1;
  }

  result = _parse_lan_parameters(&prefix, &data, ptr);
  if (result) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s has %s",
      value, entry->key.entry, section_name, result);
    return -1;
  }

  if (data.metric < RFC7181_METRIC_MIN || data.metric > RFC7181_METRIC_MAX) {
    cfg_append_printable_line(out, "Metric %u for prefix %s must be between %u and %u", data.metric, buf.buf,
      RFC7181_METRIC_MIN, RFC7181_METRIC_MAX);
    return -1;
  }
  if (data.dist > 255) {
    cfg_append_printable_line(out, "Distance %u for prefix %s must be between 0 and 255", data.dist, buf.buf);
    return -1;
  }

  return 0;
}